

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_math.cpp
# Opt level: O0

SW_FT_Int ft_trig_prenorm(SW_FT_Vector *vec)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  byte bVar6;
  long local_38;
  long local_28;
  SW_FT_Int shift;
  SW_FT_Pos y;
  SW_FT_Pos x;
  SW_FT_Vector *vec_local;
  
  lVar1 = vec->x;
  lVar2 = vec->y;
  local_28 = lVar1;
  if (lVar1 < 0) {
    local_28 = -lVar1;
  }
  local_38 = lVar2;
  if (lVar2 < 0) {
    local_38 = -lVar2;
  }
  uVar4 = (uint)local_28 | (uint)local_38;
  uVar3 = 0x1f;
  if (uVar4 != 0) {
    for (; uVar4 >> uVar3 == 0; uVar3 = uVar3 - 1) {
    }
  }
  iVar5 = -(uVar3 ^ 0x1f) + 0x1f;
  if (iVar5 < 0x1e) {
    shift = 0x1d - iVar5;
    vec->x = lVar1 << ((byte)shift & 0x3f);
    vec->y = lVar2 << ((byte)shift & 0x3f);
  }
  else {
    iVar5 = -(uVar3 ^ 0x1f) + 2;
    bVar6 = (byte)iVar5;
    vec->x = lVar1 >> (bVar6 & 0x3f);
    vec->y = lVar2 >> (bVar6 & 0x3f);
    shift = -iVar5;
  }
  return shift;
}

Assistant:

static SW_FT_Int ft_trig_prenorm(SW_FT_Vector* vec)
{
    SW_FT_Pos x, y;
    SW_FT_Int shift;

    x = vec->x;
    y = vec->y;

    shift = SW_FT_MSB(SW_FT_ABS(x) | SW_FT_ABS(y));

    if (shift <= SW_FT_TRIG_SAFE_MSB) {
        shift = SW_FT_TRIG_SAFE_MSB - shift;
        vec->x = (SW_FT_Pos)((SW_FT_ULong)x << shift);
        vec->y = (SW_FT_Pos)((SW_FT_ULong)y << shift);
    } else {
        shift -= SW_FT_TRIG_SAFE_MSB;
        vec->x = x >> shift;
        vec->y = y >> shift;
        shift = -shift;
    }

    return shift;
}